

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_pipeline(sg_pipeline pip_id,sg_pipeline_desc *desc)

{
  _sg_pipeline_t *pip_00;
  _sg_pipeline_t *pip;
  sg_pipeline_desc desc_def;
  sg_pipeline_desc *desc_local;
  sg_pipeline pip_id_local;
  
  desc_def._560_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e26,"void sg_init_pipeline(sg_pipeline, const sg_pipeline_desc *)");
  }
  _sg_pipeline_desc_defaults((sg_pipeline_desc *)&pip,desc);
  pip_00 = _sg_lookup_pipeline(&_sg.pools,pip_id.id);
  if (pip_00 != (_sg_pipeline_t *)0x0) {
    if ((pip_00->slot).state == SG_RESOURCESTATE_ALLOC) {
      _sg_init_pipeline(pip_00,(sg_pipeline_desc *)&pip);
      if (((pip_00->slot).state != SG_RESOURCESTATE_VALID) &&
         ((pip_00->slot).state != SG_RESOURCESTATE_FAILED)) {
        __assert_fail("(pip->slot.state == SG_RESOURCESTATE_VALID) || (pip->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e2c,"void sg_init_pipeline(sg_pipeline, const sg_pipeline_desc *)");
      }
    }
    else {
      _sg_log("sg_init_pipeline: pipeline must be in alloc state\n");
    }
  }
  return;
}

Assistant:

inline void sg_init_pipeline(sg_pipeline pip_id, const sg_pipeline_desc& desc) { return sg_init_pipeline(pip_id, &desc); }